

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::detail::Result::Result(Result *this,bool passed,String *decomposition)

{
  undefined8 uVar1;
  char *__dest;
  
  this->m_passed = passed;
  if (-1 < (decomposition->field_0).buf[0x17]) {
    *(undefined8 *)((long)&(this->m_decomp).field_0 + 0x10) =
         *(undefined8 *)((long)&decomposition->field_0 + 0x10);
    uVar1 = *(undefined8 *)((long)&decomposition->field_0 + 8);
    (this->m_decomp).field_0.data.ptr = (decomposition->field_0).data.ptr;
    *(undefined8 *)((long)&(this->m_decomp).field_0 + 8) = uVar1;
    return;
  }
  __dest = String::allocate(&this->m_decomp,(decomposition->field_0).data.size);
  memcpy(__dest,(decomposition->field_0).data.ptr,(ulong)(decomposition->field_0).data.size);
  return;
}

Assistant:

Result::Result(bool passed, const String& decomposition)
            : m_passed(passed)
            , m_decomp(decomposition) {}